

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  SPIREntryPoint *pSVar4;
  CompilerError *this_00;
  undefined4 in_register_0000000c;
  uint *ts_1;
  char *pcVar5;
  allocator local_39;
  string local_38;
  
  ts_1 = &switchD_0024490b::switchdataD_002c30ac;
  switch(builtin) {
  case BuiltInPosition:
    pcVar5 = "gl_Position";
    break;
  case BuiltInPointSize:
    pcVar5 = "gl_PointSize";
    break;
  case 2:
  case BuiltInSampleMask|BuiltInPointSize:
  case BuiltInWorkDim:
  case BuiltInGlobalSize:
  case BuiltInEnqueuedWorkgroupSize:
  case BuiltInGlobalOffset:
  case BuiltInGlobalLinearId:
  case BuiltInGlobalLinearId|BuiltInPointSize:
  case BuiltInSubgroupMaxSize:
  case BuiltInNumEnqueuedSubgroups:
switchD_002448e1_caseD_1145:
    ::std::__cxx11::to_string(&local_38,builtin);
    join<char_const(&)[12],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"gl_BuiltIn_",(char (*) [12])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1);
    ::std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  case BuiltInClipDistance:
    if ((this->options).es == true) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_clip_cull_distance",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    pcVar5 = "gl_ClipDistance";
    break;
  case BuiltInCullDistance:
    if ((this->options).es == true) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_clip_cull_distance",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    pcVar5 = "gl_CullDistance";
    break;
  case BuiltInVertexId:
    if ((this->options).vulkan_semantics == true) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                );
      goto LAB_00245738;
    }
    goto LAB_00244f01;
  case BuiltInInstanceId:
    if (((this->options).vulkan_semantics == true) &&
       (pSVar4 = Compiler::get_entry_point(&this->super_Compiler),
       2 < pSVar4->model - ExecutionModelIntersectionKHR)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                );
      goto LAB_00245738;
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_draw_instanced",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    goto LAB_0024531d;
  case BuiltInPrimitiveId:
    if ((storage == StorageClassInput) &&
       (pSVar4 = Compiler::get_entry_point(&this->super_Compiler),
       pSVar4->model == ExecutionModelGeometry)) {
      pcVar5 = "gl_PrimitiveIDIn";
    }
    else {
      pcVar5 = "gl_PrimitiveID";
    }
    break;
  case BuiltInInvocationId:
    pcVar5 = "gl_InvocationID";
    break;
  case BuiltInLayer:
    pcVar5 = "gl_Layer";
    break;
  case BuiltInViewportIndex:
    pcVar5 = "gl_ViewportIndex";
    break;
  case BuiltInTessLevelOuter:
    pcVar5 = "gl_TessLevelOuter";
    break;
  case BuiltInTessLevelInner:
    pcVar5 = "gl_TessLevelInner";
    break;
  case BuiltInTessCoord:
    pcVar5 = "gl_TessCoord";
    break;
  case BuiltInPatchVertices:
    pcVar5 = "gl_PatchVerticesIn";
    break;
  case BuiltInFragCoord:
    pcVar5 = "gl_FragCoord";
    break;
  case BuiltInPointCoord:
    pcVar5 = "gl_PointCoord";
    break;
  case BuiltInFrontFacing:
    pcVar5 = "gl_FrontFacing";
    break;
  case BuiltInSampleId:
    bVar2 = is_legacy(this);
    if (bVar2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Sample variables not supported in legacy GLSL.");
      goto LAB_00245738;
    }
    bVar2 = (this->options).es;
    uVar1 = (this->options).version;
    if ((uVar1 < 0x140 & bVar2) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
LAB_002453ea:
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    else if (bVar2 == false && uVar1 < 400) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_sample_shading",&local_39);
      require_extension_internal(this,&local_38);
      goto LAB_002453ea;
    }
    pcVar5 = "gl_SampleID";
    break;
  case BuiltInSamplePosition:
    bVar2 = is_legacy(this);
    if (bVar2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Sample variables not supported in legacy GLSL.");
      goto LAB_00245738;
    }
    bVar2 = (this->options).es;
    uVar1 = (this->options).version;
    if ((uVar1 < 0x140 & bVar2) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
LAB_00245359:
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    else if (bVar2 == false && uVar1 < 400) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_sample_shading",&local_39);
      require_extension_internal(this,&local_38);
      goto LAB_00245359;
    }
    pcVar5 = "gl_SamplePosition";
    break;
  case BuiltInSampleMask:
    bVar2 = is_legacy(this);
    if (bVar2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Sample variables not supported in legacy GLSL.");
      goto LAB_00245738;
    }
    bVar2 = (this->options).es;
    uVar1 = (this->options).version;
    if ((uVar1 < 0x140 & bVar2) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
LAB_0024539f:
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    else if (bVar2 == false && uVar1 < 400) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_sample_shading",&local_39);
      require_extension_internal(this,&local_38);
      goto LAB_0024539f;
    }
    if (storage == StorageClassInput) {
      pcVar5 = "gl_SampleMaskIn";
    }
    else {
      pcVar5 = "gl_SampleMask";
    }
    break;
  case BuiltInFragDepth:
    pcVar5 = "gl_FragDepth";
    break;
  case BuiltInHelperInvocation:
    pcVar5 = "gl_HelperInvocation";
    break;
  case BuiltInNumWorkgroups:
    pcVar5 = "gl_NumWorkGroups";
    break;
  case BuiltInWorkgroupSize:
    pcVar5 = "gl_WorkGroupSize";
    break;
  case BuiltInWorkgroupId:
    pcVar5 = "gl_WorkGroupID";
    break;
  case BuiltInLocalInvocationId:
    pcVar5 = "gl_LocalInvocationID";
    break;
  case BuiltInGlobalInvocationId:
    pcVar5 = "gl_GlobalInvocationID";
    break;
  case BuiltInLocalInvocationIndex:
    pcVar5 = "gl_LocalInvocationIndex";
    break;
  case BuiltInSubgroupSize:
    request_subgroup_feature(this,SubgroupSize);
    pcVar5 = "gl_SubgroupSize";
    break;
  case BuiltInNumSubgroups:
    request_subgroup_feature(this,NumSubgroups);
    pcVar5 = "gl_NumSubgroups";
    break;
  case BuiltInSubgroupId:
    request_subgroup_feature(this,SubgroupID);
    pcVar5 = "gl_SubgroupID";
    break;
  case BuiltInSubgroupLocalInvocationId:
    request_subgroup_feature(this,SubgroupInvocationID);
    pcVar5 = "gl_SubgroupInvocationID";
    break;
  case BuiltInVertexIndex:
    if ((this->options).vulkan_semantics == true) {
      pcVar5 = "gl_VertexIndex";
      break;
    }
LAB_00244f01:
    pcVar5 = "gl_VertexID";
    break;
  case BuiltInInstanceIndex:
    if ((this->options).vulkan_semantics == true) {
      pcVar5 = "gl_InstanceIndex";
      break;
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_draw_instanced",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    if ((this->options).vertex.support_nonzero_base_instance == true) {
      if ((this->options).vulkan_semantics == false) {
        ::std::__cxx11::string::string
                  ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
      }
      pcVar5 = "(gl_InstanceID + SPIRV_Cross_BaseInstance)";
      break;
    }
LAB_0024531d:
    pcVar5 = "gl_InstanceID";
    break;
  default:
    ts_1 = &switchD_00244927::switchdataD_002c3208;
    switch(builtin) {
    case BuiltInLaunchIdKHR:
      pcVar3 = "gl_LaunchIDEXT";
      pcVar5 = "gl_LaunchIDNV";
      break;
    case BuiltInLaunchSizeKHR:
      pcVar3 = "gl_LaunchSizeEXT";
      pcVar5 = "gl_LaunchSizeNV";
      break;
    case BuiltInWorldRayOriginKHR:
      pcVar3 = "gl_WorldRayOriginEXT";
      pcVar5 = "gl_WorldRayOriginNV";
      break;
    case BuiltInWorldRayDirectionKHR:
      pcVar3 = "gl_WorldRayDirectionEXT";
      pcVar5 = "gl_WorldRayDirectionNV";
      break;
    case BuiltInObjectRayOriginKHR:
      pcVar3 = "gl_ObjectRayOriginEXT";
      pcVar5 = "gl_ObjectRayOriginNV";
      break;
    case BuiltInObjectRayDirectionKHR:
      pcVar3 = "gl_ObjectRayDirectionEXT";
      pcVar5 = "gl_ObjectRayDirectionNV";
      break;
    case BuiltInRayTminKHR:
      pcVar3 = "gl_RayTminEXT";
      pcVar5 = "gl_RayTminNV";
      break;
    case BuiltInRayTmaxKHR:
      pcVar3 = "gl_RayTmaxEXT";
      pcVar5 = "gl_RayTmaxNV";
      break;
    case BuiltInInstanceCustomIndexKHR:
      pcVar3 = "gl_InstanceCustomIndexEXT";
      pcVar5 = "gl_InstanceCustomIndexNV";
      break;
    case 0x14d0:
    case 0x14d1:
    case BuiltInCurrentRayTimeNV:
    case BuiltInCurrentRayTimeNV|BuiltInPointSize:
    case 0x14d8:
    case 0x14d9:
    case 0x14da:
    case 0x14db:
    case 0x14dc:
    case 0x14dd:
    case 0x14de:
    case 0x14df:
    case 0x14e0:
    case 0x14e1:
    case 0x14e2:
    case 0x14e3:
    case 0x14e4:
    case 0x14e5:
    case 0x14e6:
      goto switchD_002448e1_caseD_1145;
    case BuiltInObjectToWorldKHR:
      pcVar3 = "gl_ObjectToWorldEXT";
      pcVar5 = "gl_ObjectToWorldNV";
      break;
    case BuiltInWorldToObjectKHR:
      pcVar3 = "gl_WorldToObjectEXT";
      pcVar5 = "gl_WorldToObjectNV";
      break;
    case BuiltInHitTNV:
      pcVar5 = "gl_HitTNV";
      goto LAB_00244b3f;
    case BuiltInHitKindKHR:
      pcVar3 = "gl_HitKindEXT";
      pcVar5 = "gl_HitKindNV";
      break;
    case BuiltInIncomingRayFlagsKHR:
      pcVar3 = "gl_IncomingRayFlagsEXT";
      pcVar5 = "gl_IncomingRayFlagsNV";
      break;
    default:
      ts_1 = &switchD_002448e1::switchdataD_002c315c;
      switch(builtin) {
      case BuiltInSubgroupEqMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar5 = "gl_SubgroupEqMask";
        break;
      case BuiltInSubgroupGeMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar5 = "gl_SubgroupGeMask";
        break;
      case BuiltInSubgroupGtMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar5 = "gl_SubgroupGtMask";
        break;
      case BuiltInSubgroupLeMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar5 = "gl_SubgroupLeMask";
        break;
      case BuiltInSubgroupLtMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar5 = "gl_SubgroupLtMask";
        break;
      case BuiltInSubgroupLtMask|BuiltInPointSize:
      case 0x1146:
      case BuiltInSubgroupLtMask|BuiltInClipDistance:
      case BuiltInDrawIndex|BuiltInPointSize:
      case BuiltInBaseVertex|BuiltInCullDistance:
      case BuiltInBaseVertex|BuiltInVertexId:
      case BuiltInBaseVertex|BuiltInInstanceId:
      case BuiltInBaseVertex|BuiltInPrimitiveId:
      case BuiltInPrimitiveShadingRateKHR|BuiltInPointSize:
      case 0x1152:
      case BuiltInPrimitiveShadingRateKHR|BuiltInClipDistance:
      case BuiltInPrimitiveShadingRateKHR|BuiltInCullDistance:
      case BuiltInPrimitiveShadingRateKHR|BuiltInVertexId:
      case BuiltInDeviceIndex|BuiltInPointSize:
      case BuiltInViewIndex|BuiltInPointSize:
      case 0x115a:
      case BuiltInViewIndex|BuiltInClipDistance:
        goto switchD_002448e1_caseD_1145;
      case BuiltInBaseVertex:
        if ((this->options).es == true) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"BaseVertex not supported in ES profile.");
          goto LAB_00245738;
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar5 = "gl_BaseVertexARB";
          }
          else {
            pcVar5 = "gl_BaseVertex";
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar5 = "SPIRV_Cross_BaseVertex";
        }
        break;
      case BuiltInBaseInstance:
        if ((this->options).es == true) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"BaseInstance not supported in ES profile.");
          goto LAB_00245738;
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar5 = "gl_BaseInstanceARB";
          }
          else {
            pcVar5 = "gl_BaseInstance";
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar5 = "SPIRV_Cross_BaseInstance";
        }
        break;
      case BuiltInDrawIndex:
        if ((this->options).es == true) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"DrawIndex not supported in ES profile.");
          goto LAB_00245738;
        }
        if ((this->options).vulkan_semantics == true) {
          if (0x1cb < (this->options).version) {
            pcVar5 = "gl_DrawID";
            break;
          }
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
        }
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar5 = "gl_DrawIDARB";
        break;
      case BuiltInPrimitiveShadingRateKHR:
        if ((this->options).vulkan_semantics == false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,"Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
          goto LAB_00245738;
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_fragment_shading_rate",&local_39)
        ;
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar5 = "gl_PrimitiveShadingRateEXT";
        break;
      case BuiltInDeviceIndex:
        if ((this->options).vulkan_semantics == false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"Need Vulkan semantics for device group support.");
          goto LAB_00245738;
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_device_group",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar5 = "gl_DeviceIndex";
        break;
      case BuiltInViewIndex:
        if ((this->options).vulkan_semantics == true) {
          pcVar5 = "gl_ViewIndex";
        }
        else {
          pcVar5 = "gl_ViewID_OVR";
        }
        break;
      case BuiltInShadingRateKHR:
        if ((this->options).vulkan_semantics == false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"Can only use ShadingRateKHR in Vulkan GLSL.");
          goto LAB_00245738;
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_fragment_shading_rate",&local_39)
        ;
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar5 = "gl_ShadingRateEXT";
        break;
      default:
        ts_1 = &switchD_00244959::switchdataD_002c31d0;
        switch(builtin) {
        case BuiltInBaryCoordKHR:
          bVar2 = (this->options).es;
          uVar1 = (this->options).version;
          if ((uVar1 < 0x140 & bVar2) == 1) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"gl_BaryCoordEXT requires ESSL 320.");
          }
          else {
            if (bVar2 != false || 0x1c1 < uVar1) {
              if (this->barycentric_is_nv == true) {
                ::std::__cxx11::string::string
                          ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
                require_extension_internal(this,&local_38);
                ::std::__cxx11::string::~string((string *)&local_38);
                pcVar5 = "gl_BaryCoordNV";
              }
              else {
                ::std::__cxx11::string::string
                          ((string *)&local_38,"GL_EXT_fragment_shader_barycentric",&local_39);
                require_extension_internal(this,&local_38);
                ::std::__cxx11::string::~string((string *)&local_38);
                pcVar5 = "gl_BaryCoordEXT";
              }
              break;
            }
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"gl_BaryCoordEXT requires GLSL 450.");
          }
          goto LAB_00245738;
        case BuiltInBaryCoordNoPerspKHR:
          bVar2 = (this->options).es;
          uVar1 = (this->options).version;
          if ((uVar1 < 0x140 & bVar2) == 1) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"gl_BaryCoordNoPerspEXT requires ESSL 320.");
          }
          else {
            if (bVar2 != false || 0x1c1 < uVar1) {
              if (this->barycentric_is_nv == true) {
                ::std::__cxx11::string::string
                          ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
                require_extension_internal(this,&local_38);
                ::std::__cxx11::string::~string((string *)&local_38);
                pcVar5 = "gl_BaryCoordNoPerspNV";
              }
              else {
                ::std::__cxx11::string::string
                          ((string *)&local_38,"GL_EXT_fragment_shader_barycentric",&local_39);
                require_extension_internal(this,&local_38);
                ::std::__cxx11::string::~string((string *)&local_38);
                pcVar5 = "gl_BaryCoordNoPerspEXT";
              }
              break;
            }
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"gl_BaryCoordNoPerspEXT requires GLSL 450.");
          }
LAB_00245738:
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        case BuiltInMeshViewCountNV|BuiltInInvocationId:
        case BuiltInMeshViewCountNV|BuiltInLayer:
        case BuiltInMeshViewCountNV|BuiltInViewportIndex:
        case BuiltInMeshViewCountNV|BuiltInTessLevelOuter:
        case BuiltInFragSizeEXT:
        case BuiltInFragInvocationCountEXT:
        case BuiltInPrimitiveTriangleIndicesEXT|BuiltInPointSize:
        case 0x14b2:
          goto switchD_002448e1_caseD_1145;
        case BuiltInPrimitivePointIndicesEXT:
          pcVar5 = "gl_PrimitivePointIndicesEXT";
          break;
        case BuiltInPrimitiveLineIndicesEXT:
          pcVar5 = "gl_PrimitiveLineIndicesEXT";
          break;
        case BuiltInPrimitiveTriangleIndicesEXT:
          pcVar5 = "gl_PrimitiveTriangleIndicesEXT";
          break;
        case BuiltInCullPrimitiveEXT:
          pcVar5 = "gl_CullPrimitiveEXT";
          break;
        default:
          if (builtin == BuiltInFragStencilRefEXT) {
            if ((this->options).es != false) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(this_00,"Stencil export not supported in GLES.");
              goto LAB_00245738;
            }
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_stencil_export",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar5 = "gl_FragStencilRefARB";
          }
          else {
            ts_1 = (uint *)CONCAT44(in_register_0000000c,storage);
            if (builtin != BuiltInFullyCoveredEXT) goto switchD_002448e1_caseD_1145;
            if ((this->options).es != false) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_00,"Need desktop GL to use GL_NV_conservative_raster_underestimation."
                        );
              goto LAB_00245738;
            }
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_NV_conservative_raster_underestimation",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar5 = "gl_FragFullyCoveredNV";
          }
        }
      }
      goto LAB_00244b3f;
    }
    if (this->ray_tracing_is_khr != false) {
      pcVar5 = pcVar3;
    }
  }
LAB_00244b3f:
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_ClipDistance";
	}
	case BuiltInCullDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_CullDistance";
	}
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
		return "gl_Layer";
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInPatchVertices:
		return "gl_PatchVerticesIn";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseVertex";

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseInstance";

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "gl_DrawIDARB";

	case BuiltInSampleId:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
			return "gl_ViewIndex";
		else
			return "gl_ViewID_OVR";

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdKHR:
		return ray_tracing_is_khr ? "gl_LaunchIDEXT" : "gl_LaunchIDNV";
	case BuiltInLaunchSizeKHR:
		return ray_tracing_is_khr ? "gl_LaunchSizeEXT" : "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginKHR:
		return ray_tracing_is_khr ? "gl_WorldRayOriginEXT" : "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_WorldRayDirectionEXT" : "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayOriginEXT" : "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayDirectionEXT" : "gl_ObjectRayDirectionNV";
	case BuiltInRayTminKHR:
		return ray_tracing_is_khr ? "gl_RayTminEXT" : "gl_RayTminNV";
	case BuiltInRayTmaxKHR:
		return ray_tracing_is_khr ? "gl_RayTmaxEXT" : "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexKHR:
		return ray_tracing_is_khr ? "gl_InstanceCustomIndexEXT" : "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldKHR:
		return ray_tracing_is_khr ? "gl_ObjectToWorldEXT" : "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectKHR:
		return ray_tracing_is_khr ? "gl_WorldToObjectEXT" : "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		// gl_HitTEXT is an alias of RayTMax in KHR.
		return "gl_HitTNV";
	case BuiltInHitKindKHR:
		return ray_tracing_is_khr ? "gl_HitKindEXT" : "gl_HitKindNV";
	case BuiltInIncomingRayFlagsKHR:
		return ray_tracing_is_khr ? "gl_IncomingRayFlagsEXT" : "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordKHR:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordEXT";
		}
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspEXT";
		}
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInPrimitiveShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_PrimitiveShadingRateEXT";
	}

	case BuiltInShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use ShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_ShadingRateEXT";
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	case BuiltInFullyCoveredEXT:
		if (!options.es)
			require_extension_internal("GL_NV_conservative_raster_underestimation");
		else
			SPIRV_CROSS_THROW("Need desktop GL to use GL_NV_conservative_raster_underestimation.");
		return "gl_FragFullyCoveredNV";

	case BuiltInPrimitiveTriangleIndicesEXT:
		return "gl_PrimitiveTriangleIndicesEXT";
	case BuiltInPrimitiveLineIndicesEXT:
		return "gl_PrimitiveLineIndicesEXT";
	case BuiltInPrimitivePointIndicesEXT:
		return "gl_PrimitivePointIndicesEXT";
	case BuiltInCullPrimitiveEXT:
		return "gl_CullPrimitiveEXT";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}